

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  int in_R9D;
  long lVar7;
  bench_inv data;
  int in_stack_fffffffffffff8f8;
  undefined1 local_700 [1744];
  
  pcVar4 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar4 == (char *)0x0) {
    uVar5 = 20000;
  }
  else {
    uVar5 = strtol(pcVar4,(char **)0x0,0);
  }
  if (1 < argc) {
    lVar7 = (ulong)(uint)argc << 3;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121469;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"-h");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 != lVar6) {
LAB_001214cb:
      puts("Benchmarks various internal routines.");
      putchar(10);
      printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
      puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
      putchar(10);
      puts("Usage: ./bench_internal [args]");
      puts("By default, all benchmarks will be run.");
      puts("args:");
      puts("    help       : display this help and exit");
      puts("    scalar     : all scalar operations (add, half, inverse, mul, negate, split)");
      puts(
          "    field      : all field operations (half, inverse, issquare, mul, normalize, sqr, sqrt)"
          );
      puts("    group      : all group operations (add, double, to_affine)");
      puts("    ecmult     : all point multiplication operations (ecmult_wnaf) ");
      puts("    hash       : all hash algorithms (hmac, rng6979, sha256)");
      puts("    context    : all context object operations (context_create)");
      putchar(10);
      return 0;
    }
LAB_00121469:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121496;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"--help");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 != lVar6) goto LAB_001214cb;
LAB_00121496:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121591;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"help");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 != lVar6) goto LAB_001214cb;
  }
LAB_00121591:
  pcVar4 = "    Max(us)    ";
  printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ");
  putchar(10);
  iVar2 = (int)uVar5;
  if (argc == 1) {
LAB_0012162b:
    run_benchmark("scalar_half",bench_scalar_half,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 100),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_001215fe;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"scalar");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_0012162b;
LAB_001215fe:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121647;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"half");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_0012162b;
  }
LAB_00121647:
  if (argc == 1) {
LAB_001216ad:
    run_benchmark("scalar_add",bench_scalar_add,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 100),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121680;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"scalar");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_001216ad;
LAB_00121680:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_001216c9;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"add");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_001216ad;
  }
LAB_001216c9:
  if (argc == 1) {
LAB_0012172f:
    run_benchmark("scalar_negate",bench_scalar_negate,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 100),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121702;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"scalar");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_0012172f;
LAB_00121702:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_0012174b;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"negate");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_0012172f;
  }
LAB_0012174b:
  if (argc == 1) {
LAB_001217b1:
    run_benchmark("scalar_mul",bench_scalar_mul,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 10),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121784;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"scalar");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_001217b1;
LAB_00121784:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_001217d0;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"mul");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_001217b1;
  }
LAB_001217d0:
  if (argc == 1) {
LAB_00121836:
    run_benchmark("scalar_split",bench_scalar_split,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121809;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"scalar");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121836;
LAB_00121809:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121851;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"split");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121836;
  }
LAB_00121851:
  if (argc == 1) {
LAB_001218b7:
    run_benchmark("scalar_inverse",bench_scalar_inverse,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_0012188a;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"scalar");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_001218b7;
LAB_0012188a:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_001218d2;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"inverse");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_001218b7;
  }
LAB_001218d2:
  if (argc == 1) {
LAB_00121938:
    run_benchmark("scalar_inverse_var",bench_scalar_inverse_var,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_0012190b;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"scalar");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121938;
LAB_0012190b:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121953;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"inverse");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121938;
  }
LAB_00121953:
  if (argc == 1) {
LAB_001219b9:
    run_benchmark("field_half",bench_field_half,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 100),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_0012198c;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"field");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_001219b9;
LAB_0012198c:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_001219d5;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"half");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_001219b9;
  }
LAB_001219d5:
  if (argc == 1) {
LAB_00121a3b:
    run_benchmark("field_normalize",bench_field_normalize,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 100),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121a0e;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"field");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121a3b;
LAB_00121a0e:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121a57;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"normalize");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121a3b;
  }
LAB_00121a57:
  if (argc == 1) {
LAB_00121abd:
    run_benchmark("field_normalize_weak",bench_field_normalize_weak,(_func_void_void_ptr *)local_700
                  ,(_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 100),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121a90;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"field");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121abd;
LAB_00121a90:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121ad9;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"normalize");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121abd;
  }
LAB_00121ad9:
  if (argc == 1) {
LAB_00121b3f:
    run_benchmark("field_sqr",bench_field_sqr,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 10),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121b12;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"field");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121b3f;
LAB_00121b12:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121b5e;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"sqr");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121b3f;
  }
LAB_00121b5e:
  if (argc == 1) {
LAB_00121bc4:
    run_benchmark("field_mul",bench_field_mul,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 10),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121b97;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"field");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121bc4;
LAB_00121b97:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121be3;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"mul");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121bc4;
  }
LAB_00121be3:
  if (argc == 1) {
LAB_00121c49:
    run_benchmark("field_inverse",bench_field_inverse,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121c1c;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"field");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121c49;
LAB_00121c1c:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121c64;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"inverse");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121c49;
  }
LAB_00121c64:
  if (argc == 1) {
LAB_00121cca:
    run_benchmark("field_inverse_var",bench_field_inverse_var,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121c9d;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"field");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121cca;
LAB_00121c9d:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121ce5;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"inverse");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121cca;
  }
LAB_00121ce5:
  if (argc == 1) {
LAB_00121d4b:
    run_benchmark("field_is_square_var",bench_field_is_square_var,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121d1e;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"field");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121d4b;
LAB_00121d1e:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121d66;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"issquare");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121d4b;
  }
LAB_00121d66:
  if (argc == 1) {
LAB_00121dcc:
    run_benchmark("field_sqrt",bench_field_sqrt,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121d9f;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"field");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121dcc;
LAB_00121d9f:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121de7;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"sqrt");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121dcc;
  }
LAB_00121de7:
  if (argc == 1) {
LAB_00121e4d:
    run_benchmark("group_double_var",bench_group_double_var,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 10),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121e20;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"group");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121e4d;
LAB_00121e20:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121e6c;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"double");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121e4d;
  }
LAB_00121e6c:
  if (argc == 1) {
LAB_00121ed2:
    run_benchmark("group_add_var",bench_group_add_var,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 10),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121ea5;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"group");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121ed2;
LAB_00121ea5:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121ef1;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"add");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121ed2;
  }
LAB_00121ef1:
  if (argc == 1) {
LAB_00121f57:
    run_benchmark("group_add_affine",bench_group_add_affine,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 10),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121f2a;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"group");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121f57;
LAB_00121f2a:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121f76;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"add");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121f57;
  }
LAB_00121f76:
  if (argc == 1) {
LAB_00121fdc:
    run_benchmark("group_add_affine_var",bench_group_add_affine_var,(_func_void_void_ptr *)local_700
                  ,(_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 10),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121faf;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"group");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121fdc;
LAB_00121faf:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00121ffb;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"add");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00121fdc;
  }
LAB_00121ffb:
  if (argc == 1) {
LAB_00122061:
    run_benchmark("group_add_zinv_var",bench_group_add_zinv_var,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar2 * 10),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00122034;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"group");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00122061;
LAB_00122034:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00122080;
      iVar3 = strcmp(*(char **)((long)argv + lVar6),"add");
      lVar1 = lVar6 + 8;
    } while (iVar3 != 0);
    if (lVar7 != lVar6) goto LAB_00122061;
  }
LAB_00122080:
  if (argc == 1) {
LAB_001220e6:
    run_benchmark("group_to_affine_var",bench_group_to_affine_var,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_001220b9;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"group");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 != lVar6) goto LAB_001220e6;
LAB_001220b9:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00122101;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"to_affine");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 != lVar6) goto LAB_001220e6;
  }
LAB_00122101:
  if (argc == 1) {
LAB_00122167:
    run_benchmark("ecmult_wnaf",bench_ecmult_wnaf,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_0012213a;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"ecmult");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 != lVar6) goto LAB_00122167;
LAB_0012213a:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00122182;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"wnaf");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 != lVar6) goto LAB_00122167;
  }
LAB_00122182:
  if (argc == 1) {
LAB_001221e8:
    run_benchmark("hash_sha256",bench_sha256,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_001221bb;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"hash");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 != lVar6) goto LAB_001221e8;
LAB_001221bb:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00122203;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"sha256");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 != lVar6) goto LAB_001221e8;
  }
LAB_00122203:
  if (argc == 1) {
LAB_00122269:
    run_benchmark("hash_hmac_sha256",bench_hmac_sha256,(_func_void_void_ptr *)local_700,
                  (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                  in_stack_fffffffffffff8f8);
  }
  else {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_0012223c;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"hash");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 != lVar6) goto LAB_00122269;
LAB_0012223c:
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_00122284;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"hmac");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 != lVar6) goto LAB_00122269;
  }
LAB_00122284:
  if (argc != 1) {
    lVar7 = (long)argc * 8;
    lVar1 = 8;
    do {
      lVar6 = lVar1;
      if (lVar7 == lVar6) goto LAB_001222bd;
      iVar2 = strcmp(*(char **)((long)argv + lVar6),"hash");
      lVar1 = lVar6 + 8;
    } while (iVar2 != 0);
    if (lVar7 == lVar6) {
LAB_001222bd:
      lVar1 = 8;
      do {
        lVar6 = lVar1;
        if (lVar7 == lVar6) goto LAB_00122305;
        iVar2 = strcmp(*(char **)((long)argv + lVar6),"rng6979");
        lVar1 = lVar6 + 8;
      } while (iVar2 != 0);
      if (lVar7 == lVar6) goto LAB_00122305;
    }
  }
  run_benchmark("hash_rfc6979_hmac_sha256",bench_rfc6979_hmac_sha256,
                (_func_void_void_ptr *)local_700,(_func_void_void_ptr_int *)(uVar5 & 0xffffffff),
                pcVar4,in_R9D,in_stack_fffffffffffff8f8);
LAB_00122305:
  if (argc != 1) {
    lVar1 = 8;
    do {
      lVar7 = lVar1;
      if ((long)argc * 8 == lVar7) {
        return 0;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar7),"context");
      lVar1 = lVar7 + 8;
    } while (iVar2 != 0);
    if ((long)argc * 8 == lVar7) {
      return 0;
    }
  }
  run_benchmark("context_create",bench_context,(_func_void_void_ptr *)local_700,
                (_func_void_void_ptr_int *)(uVar5 & 0xffffffff),pcVar4,in_R9D,
                in_stack_fffffffffffff8f8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    bench_inv data;
    int default_iters = 20000;
    int iters = get_iters(default_iters);
    int d = argc == 1; /* default */

    if (argc > 1) {
        if (have_flag(argc, argv, "-h")
           || have_flag(argc, argv, "--help")
           || have_flag(argc, argv, "help")) {
            help(default_iters);
            return EXIT_SUCCESS;
        }
    }

    print_output_table_header_row();

    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "half")) run_benchmark("scalar_half", bench_scalar_half, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "add")) run_benchmark("scalar_add", bench_scalar_add, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "negate")) run_benchmark("scalar_negate", bench_scalar_negate, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "mul")) run_benchmark("scalar_mul", bench_scalar_mul, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "split")) run_benchmark("scalar_split", bench_scalar_split, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "inverse")) run_benchmark("scalar_inverse", bench_scalar_inverse, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "inverse")) run_benchmark("scalar_inverse_var", bench_scalar_inverse_var, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "half")) run_benchmark("field_half", bench_field_half, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "normalize")) run_benchmark("field_normalize", bench_field_normalize, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "normalize")) run_benchmark("field_normalize_weak", bench_field_normalize_weak, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "sqr")) run_benchmark("field_sqr", bench_field_sqr, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "mul")) run_benchmark("field_mul", bench_field_mul, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "inverse")) run_benchmark("field_inverse", bench_field_inverse, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "inverse")) run_benchmark("field_inverse_var", bench_field_inverse_var, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "issquare")) run_benchmark("field_is_square_var", bench_field_is_square_var, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "sqrt")) run_benchmark("field_sqrt", bench_field_sqrt, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "double")) run_benchmark("group_double_var", bench_group_double_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_var", bench_group_add_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_affine", bench_group_add_affine, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_affine_var", bench_group_add_affine_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_zinv_var", bench_group_add_zinv_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "to_affine")) run_benchmark("group_to_affine_var", bench_group_to_affine_var, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "ecmult") || have_flag(argc, argv, "wnaf")) run_benchmark("ecmult_wnaf", bench_ecmult_wnaf, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "hash") || have_flag(argc, argv, "sha256")) run_benchmark("hash_sha256", bench_sha256, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "hash") || have_flag(argc, argv, "hmac")) run_benchmark("hash_hmac_sha256", bench_hmac_sha256, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "hash") || have_flag(argc, argv, "rng6979")) run_benchmark("hash_rfc6979_hmac_sha256", bench_rfc6979_hmac_sha256, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "context")) run_benchmark("context_create", bench_context, bench_setup, NULL, &data, 10, iters);

    return EXIT_SUCCESS;
}